

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::setRealParam
          (SoPlexBase<double> *this,RealParam param,Real value,bool init)

{
  double dVar1;
  int iVar2;
  Verbosity VVar3;
  element_type *peVar4;
  byte in_DL;
  RealParam in_ESI;
  SoPlexBase<double> *in_RDI;
  double in_XMM0_Qa;
  Real RVar5;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Real tmp_value;
  char *in_stack_fffffffffffffee8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *v;
  undefined2 in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef2;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffef8;
  data_type *this_00;
  Verbosity in_stack_ffffffffffffff20;
  Verbosity in_stack_ffffffffffffff24;
  Verbosity local_c8;
  Verbosity local_c4;
  Real local_c0;
  byte local_b1;
  data_type local_b0;
  bool local_91;
  data_type *local_90;
  Rational *local_88;
  data_type *local_80;
  data_type *local_78;
  Rational *local_70;
  data_type *local_68;
  undefined8 in_stack_ffffffffffffffa0;
  data_type *pdVar6;
  undefined2 in_stack_ffffffffffffffa8;
  short sVar7;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_ffffffffffffffb8;
  
  local_b1 = in_DL & 1;
  local_b0._0_8_ = in_XMM0_Qa;
  local_b0.la[1]._4_4_ = in_ESI;
  if (local_b1 == 0) {
    RVar5 = realParam(in_RDI,in_ESI);
    if ((in_XMM0_Qa == RVar5) && (!NAN(in_XMM0_Qa) && !NAN(RVar5))) {
      return true;
    }
  }
  if (((double)local_b0.la[0] <
       *(double *)(Settings::realParam + (ulong)(uint)local_b0.la[1]._4_4_ * 8 + 0x798)) ||
     (*(double *)(Settings::realParam + (ulong)(uint)local_b0.la[1]._4_4_ * 8 + 0x870) <=
      (double)local_b0.la[0] &&
      (double)local_b0.la[0] !=
      *(double *)(Settings::realParam + (ulong)(uint)local_b0.la[1]._4_4_ * 8 + 0x870))) {
    local_91 = false;
  }
  else {
    local_c0 = (Real)local_b0.la[0];
    switch(local_b0.la[1]._4_4_) {
    case 0:
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(in_stack_ffffffffffffffb8,
                  (longdouble)CONCAT28(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0));
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d6032);
      Tolerances::setFeastol(peVar4,(Real)local_b0.la[0]);
      break;
    case 1:
      if (1e-10 <= (double)local_b0.la[0]) {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)&local_b0.ld,
                    (longdouble)CONCAT28(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0));
        peVar4 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d61f4);
        Tolerances::setOpttol(peVar4,(Real)local_b0.la[0]);
      }
      else {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar3)) {
          local_c4 = SPxOut::getVerbosity(&in_RDI->spxout);
          local_c8 = WARNING;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_c8);
          soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)
                             ,in_stack_fffffffffffffee8);
          soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)
                             ,(double)in_stack_fffffffffffffee8);
          soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)
                             ,in_stack_fffffffffffffee8);
          soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)
                             ,(double)in_stack_fffffffffffffee8);
          soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)
                             ,in_stack_fffffffffffffee8);
          SPxOut::setVerbosity(&in_RDI->spxout,&local_c4);
        }
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=(in_stack_ffffffffffffffb8,
                    (longdouble)CONCAT28(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0));
        peVar4 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d6185);
        Tolerances::setOpttol(peVar4,1e-10);
      }
      break;
    case 2:
      std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1d6215);
      Tolerances::setEpsilon
                ((Tolerances *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0),
                 (Real)in_stack_fffffffffffffee8);
      break;
    case 3:
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d6236);
      Tolerances::setEpsilonFactorization(peVar4,(Real)local_b0.la[0]);
      break;
    case 4:
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d6257);
      Tolerances::setEpsilonUpdate(peVar4,(Real)local_b0.la[0]);
      break;
    case 5:
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d6278);
      Tolerances::setEpsilonPivot(peVar4,(Real)local_b0.la[0]);
      break;
    case 6:
      sVar7 = (short)in_RDI + 0x40;
      this_00 = &local_b0;
      pdVar6 = this_00;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(in_stack_ffffffffffffffb8,(longdouble)CONCAT28(sVar7,this_00));
      local_70 = &in_RDI->_rationalNegInfty;
      v = SUB108((longdouble)*(double *)&(this_00->ld).capacity,0);
      local_78 = this_00;
      local_68 = this_00;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(in_stack_ffffffffffffffb8,(longdouble)CONCAT28(sVar7,pdVar6));
      boost::multiprecision::operator-(v);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::operator=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)&this_00->ld,
                  (expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                   *)in_stack_fffffffffffffef8);
      iVar2 = intParam(in_RDI,SYNCMODE);
      if (iVar2 != 0) {
        _recomputeRangeTypesRational
                  ((SoPlexBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      break;
    case 7:
      break;
    case 8:
      SPxSolverBase<double>::toggleTerminationValue(&in_RDI->_solver,true);
      break;
    case 9:
      SPxSolverBase<double>::toggleTerminationValue(&in_RDI->_solver,true);
      break;
    case 10:
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d63bc);
      Tolerances::setFloatingPointFeastol(peVar4,(Real)local_b0.la[0]);
      break;
    case 0xb:
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d63dd);
      Tolerances::setFloatingPointOpttol(peVar4,(Real)local_b0.la[0]);
      break;
    case 0xc:
      local_88 = &in_RDI->_rationalMaxscaleincr;
      local_90 = &local_b0;
      local_80 = local_90;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(in_stack_ffffffffffffffb8,
                  (longdouble)CONCAT28(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0));
      break;
    case 0xd:
      break;
    case 0xe:
      break;
    case 0xf:
      break;
    case 0x10:
      break;
    case 0x11:
      break;
    case 0x12:
      break;
    case 0x13:
      break;
    case 0x14:
      break;
    case 0x15:
      break;
    case 0x16:
      if (in_RDI->_scaler != (SPxScaler<double> *)0x0) {
        (*in_RDI->_scaler->_vptr_SPxScaler[10])(local_b0.la[0],in_RDI->_scaler,"realparam");
      }
      break;
    case 0x17:
      if (in_RDI->_realLP != (SPxLPBase<double> *)0x0) {
        SPxLPBase<double>::changeObjOffset<double>(in_RDI->_realLP,(double *)local_b0.la);
      }
      if (in_RDI->_rationalLP != (SPxLPRational *)0x0) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::changeObjOffset<double>
                  (in_stack_fffffffffffffef8,
                   (double *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
      }
      break;
    case 0x18:
      SLUFactor<double>::setMarkowitz(&in_RDI->_slufactor,(double)local_b0.la[0]);
      break;
    case 0x19:
      dVar1 = in_RDI->_currentSettings->_realParamValues[(uint)local_b0.la[1]._4_4_];
      if ((dVar1 != (double)local_b0.la[0]) || (NAN(dVar1) || NAN((double)local_b0.la[0]))) {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          SPxOut::getVerbosity(&in_RDI->spxout);
          SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffff20);
          soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)
                             ,in_stack_fffffffffffffee8);
          SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffff24);
        }
        return false;
      }
      break;
    case 0x1a:
      break;
    default:
      return false;
    }
    in_RDI->_currentSettings->_realParamValues[(uint)local_b0.la[1]._4_4_] = local_c0;
    local_91 = true;
  }
  return local_91;
}

Assistant:

bool SoPlexBase<R>::setRealParam(const RealParam param, const Real value, const bool init)
{
   assert(param >= 0);
   assert(param < REALPARAM_COUNT);
   assert(init || _isConsistent());

   if(!init && value == realParam(param))
      return true;

   if(value < _currentSettings->realParam.lower[param]
         || value > _currentSettings->realParam.upper[param])
      return false;

   // required to set a different feastol or opttol
   Real tmp_value = value;

   switch(param)
   {
   // primal feasibility tolerance; passed to the floating point solver only when calling solve()
   case SoPlexBase<R>::FEASTOL:
#ifndef SOPLEX_WITH_BOOST
      if(value < SOPLEX_DEFAULT_EPS_PIVOR)
      {
         SPX_MSG_WARNING(spxout, spxout << "Cannot set feasibility tolerance to small value " << value <<
                         " without GMP - using " << SOPLEX_DEFAULT_EPS_PIVOR << ".\n");
         _rationalFeastol = SOPLEX_DEFAULT_EPS_PIVOR;
         this->_tolerances->setFeastol(SOPLEX_DEFAULT_EPS_PIVOR);
         break;
      }

#endif
      _rationalFeastol = value;
      this->_tolerances->setFeastol(value);
      break;

   // dual feasibility tolerance; passed to the floating point solver only when calling solve()
   case SoPlexBase<R>::OPTTOL:
#ifndef SOPLEX_WITH_GMP
      if(value < SOPLEX_DEFAULT_EPS_PIVOR)
      {
         SPX_MSG_WARNING(spxout, spxout << "Cannot set optimality tolerance to small value " << value <<
                         " without GMP - using " << SOPLEX_DEFAULT_EPS_PIVOR << ".\n");
         _rationalOpttol = SOPLEX_DEFAULT_EPS_PIVOR;
         this->_tolerances->setOpttol(SOPLEX_DEFAULT_EPS_PIVOR);
         break;
      }

#endif
      _rationalOpttol = value;
      this->_tolerances->setOpttol(value);
      break;

   // general zero tolerance
   case SoPlexBase<R>::EPSILON_ZERO:
      _tolerances->setEpsilon(Real(value));
      break;

   // zero tolerance used in factorization
   case SoPlexBase<R>::EPSILON_FACTORIZATION:
      _tolerances->setEpsilonFactorization(Real(value));
      break;

   // zero tolerance used in update of the factorization
   case SoPlexBase<R>::EPSILON_UPDATE:
      _tolerances->setEpsilonUpdate(Real(value));
      break;

   // pivot zero tolerance used in factorization (declare numerical singularity for small LU pivots)
   case SoPlexBase<R>::EPSILON_PIVOT:
      _tolerances->setEpsilonPivot(Real(value));
      break;

   // infinity threshold
   case SoPlexBase<R>::INFTY:
#ifdef SOPLEX_WITH_BOOST
      _rationalPosInfty = value;
      // boost is treating -value as an expression and not just a number<T> So
      // doing -val won't work since Rational doesn't have an operator= that
      // accepts boost expressions. 0-value is a simple fix.

      // @todo Implement expression template?
      // A work around to avoid expression template
      _rationalNegInfty = value;
      _rationalNegInfty = -_rationalNegInfty;
#endif

      if(intParam(SoPlexBase<R>::SYNCMODE) != SYNCMODE_ONLYREAL)
         _recomputeRangeTypesRational();

      break;

   // time limit in seconds (INFTY if unlimited)
   case SoPlexBase<R>::TIMELIMIT:
      break;

   // lower limit on objective value is set in solveReal()
   case SoPlexBase<R>::OBJLIMIT_LOWER:
      this->_solver.toggleTerminationValue(true);
      break;

   // upper limit on objective value is set in solveReal()
   case SoPlexBase<R>::OBJLIMIT_UPPER:
      this->_solver.toggleTerminationValue(true);
      break;

   // working tolerance for feasibility in floating-point solver
   case SoPlexBase<R>::FPFEASTOL:
      this->_tolerances->setFloatingPointFeastol(value);
      break;

   // working tolerance for optimality in floating-point solver
   case SoPlexBase<R>::FPOPTTOL:
      this->_tolerances->setFloatingPointOpttol(value);
      break;

   // maximum increase of scaling factors between refinements
   case SoPlexBase<R>::MAXSCALEINCR:
      _rationalMaxscaleincr = value;
      break;

   // lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)
   case SoPlexBase<R>::LIFTMINVAL:
      break;

   // upper threshold in lifting (nonzero matrix coefficients with larger absolute value will be reformulated)
   case SoPlexBase<R>::LIFTMAXVAL:
      break;

   // threshold for sparse pricing
   case SoPlexBase<R>::SPARSITY_THRESHOLD:
      break;

   // threshold on number of rows vs. number of columns for switching from column to row representations in auto mode
   case SoPlexBase<R>::REPRESENTATION_SWITCH:
      break;

   // geometric frequency at which to apply rational reconstruction
   case SoPlexBase<R>::RATREC_FREQ:
      break;

   // minimal reduction (sum of removed rows/cols) to continue simplification
   case SoPlexBase<R>::MINRED:
      break;

   case SoPlexBase<R>::REFAC_BASIS_NNZ:
      break;

   case SoPlexBase<R>::REFAC_UPDATE_FILL:
      break;

   case SoPlexBase<R>::REFAC_MEM_FACTOR:
      break;

   // accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)
   case SoPlexBase<R>::LEASTSQ_ACRCY:
      if(_scaler)
         _scaler->setRealParam(value);

      break;

   // objective offset
   case SoPlexBase<R>::OBJ_OFFSET:
      if(_realLP)
         _realLP->changeObjOffset(value);

      if(_rationalLP)
         _rationalLP->changeObjOffset(value);

      break;

   case SoPlexBase<R>::MIN_MARKOWITZ:
      _slufactor.setMarkowitz(value);
      break;

   case SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC:
#ifdef SOPLEX_WITH_PAPILO
      _simplifierPaPILO.setModifyConsFrac(value);
#else

      if(_currentSettings->_realParamValues[param] != value)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Setting Parameter simplifier_modifyrowfac is only possible if SoPlex is build with PaPILO\n");
         return false;
      }

#endif
      break;

   // factor by which the precision of the floating-point solver is multiplied
   case SoPlexBase<R>::PRECISION_BOOSTING_FACTOR:
      break;

   default:
      return false;
   }

   _currentSettings->_realParamValues[param] = tmp_value;
   return true;
}